

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O3

string * __thiscall
flatbuffers::cpp::CppGenerator::GenTypeNative_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,Type *type,bool invector,
          FieldDef *field,bool forcopy)

{
  StructDef *pSVar1;
  EnumDef *def;
  const_iterator cVar2;
  long *plVar3;
  size_type *psVar4;
  long *plVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  long lVar7;
  bool bVar8;
  string nn;
  string type_name;
  _Alloc_hider local_f8;
  StructDef *local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_e8;
  string *local_d8;
  string local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_d8 = __return_storage_ptr__;
  switch(type->base_type) {
  case BASE_TYPE_STRING:
    NativeString_abi_cxx11_(__return_storage_ptr__,this,field);
    break;
  case BASE_TYPE_VECTOR:
  case BASE_TYPE_VECTOR64:
    local_f8._M_p._4_4_ = 0;
    local_f8._M_p._0_4_ = type->element;
    local_f0 = type->struct_def;
    aStack_e8._M_allocated_capacity = (size_type)type->enum_def;
    aStack_e8._8_2_ = type->fixed_length;
    GenTypeNative_abi_cxx11_(&local_d0,this,(Type *)&local_f8,true,field,false);
    pSVar1 = type->struct_def;
    if (pSVar1 == (StructDef *)0x0) {
LAB_0018838d:
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8,
                     "std::vector<",&local_d0);
      __return_storage_ptr__ = local_d8;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_f8);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar4 = (size_type *)(plVar3 + 2);
      if ((size_type *)*plVar3 == psVar4) {
        lVar7 = plVar3[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar7;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
      }
      __return_storage_ptr__->_M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      local_50.field_2._M_allocated_capacity = aStack_e8._M_allocated_capacity;
      local_50._M_dataplus._M_p = local_f8._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_p == &aStack_e8) goto LAB_001886bb;
    }
    else {
      local_f8._M_p = (pointer)&aStack_e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"native_custom_alloc","");
      cVar2 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                      *)&(pSVar1->super_Definition).attributes,(key_type *)&local_f8);
      if ((_Rb_tree_header *)cVar2._M_node ==
          &(pSVar1->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header) {
        bVar8 = true;
      }
      else {
        bVar8 = *(long *)(cVar2._M_node + 2) == 0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_p != &aStack_e8) {
        operator_delete(local_f8._M_p,(ulong)(aStack_e8._M_allocated_capacity + 1));
      }
      if (bVar8) goto LAB_0018838d;
      pSVar1 = type->struct_def;
      local_f8._M_p = (pointer)&aStack_e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"native_custom_alloc","");
      __return_storage_ptr__ = local_d8;
      cVar2 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                      *)&(pSVar1->super_Definition).attributes,(key_type *)&local_f8);
      if ((_Rb_tree_header *)cVar2._M_node ==
          &(pSVar1->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header) {
        lVar7 = 0;
      }
      else {
        lVar7 = *(long *)(cVar2._M_node + 2);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_p != &aStack_e8) {
        operator_delete(local_f8._M_p,(ulong)(aStack_e8._M_allocated_capacity + 1));
      }
      std::operator+(&local_50,"std::vector<",&local_d0);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
      plVar5 = plVar3 + 2;
      if ((long *)*plVar3 == plVar5) {
        local_a0 = *plVar5;
        lStack_98 = plVar3[3];
        local_b0 = &local_a0;
      }
      else {
        local_a0 = *plVar5;
        local_b0 = (long *)*plVar3;
      }
      local_a8 = plVar3[1];
      *plVar3 = (long)plVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_b0,*(ulong *)(lVar7 + 0x20));
      plVar5 = plVar3 + 2;
      if ((long *)*plVar3 == plVar5) {
        local_80 = *plVar5;
        lStack_78 = plVar3[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar5;
        local_90 = (long *)*plVar3;
      }
      local_88 = plVar3[1];
      *plVar3 = (long)plVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_90);
      plVar5 = plVar3 + 2;
      if ((long *)*plVar3 == plVar5) {
        local_60 = *plVar5;
        lStack_58 = plVar3[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar5;
        local_70 = (long *)*plVar3;
      }
      local_68 = plVar3[1];
      *plVar3 = (long)plVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_70,(ulong)local_d0._M_dataplus._M_p);
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 == paVar6) {
        aStack_e8._M_allocated_capacity = paVar6->_M_allocated_capacity;
        aStack_e8._8_8_ = plVar3[3];
        local_f8._M_p = (pointer)&aStack_e8;
      }
      else {
        aStack_e8._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_f8._M_p = (pointer)*plVar3;
      }
      local_f0 = (StructDef *)plVar3[1];
      *plVar3 = (long)paVar6;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_f8);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar4 = (size_type *)(plVar3 + 2);
      if ((size_type *)*plVar3 == psVar4) {
        lVar7 = plVar3[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar7;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
      }
      __return_storage_ptr__->_M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_p != &aStack_e8) {
        operator_delete(local_f8._M_p,(ulong)(aStack_e8._M_allocated_capacity + 1));
      }
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      if (local_90 != &local_80) {
        operator_delete(local_90,local_80 + 1);
      }
      if (local_b0 != &local_a0) {
        operator_delete(local_b0,local_a0 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_001886bb;
    }
    operator_delete(local_50._M_dataplus._M_p,
                    (ulong)((long)&(((EnumDef *)local_50.field_2._M_allocated_capacity)->
                                   super_Definition).name._M_dataplus._M_p + 1));
    goto LAB_001886bb;
  case BASE_TYPE_STRUCT:
    pSVar1 = type->struct_def;
    local_f8._M_p = (pointer)&aStack_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
    BaseGenerator::WrapInNameSpace
              (&local_d0,&this->super_BaseGenerator,&pSVar1->super_Definition,(string *)&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_p != &aStack_e8) {
      operator_delete(local_f8._M_p,(ulong)(aStack_e8._M_allocated_capacity + 1));
    }
    pSVar1 = type->struct_def;
    if ((type->base_type == BASE_TYPE_STRUCT) && (pSVar1->fixed == true)) {
      local_f8._M_p = (pointer)&aStack_e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"native_type","");
      cVar2 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                      *)&(pSVar1->super_Definition).attributes,(key_type *)&local_f8);
      if ((_Rb_tree_header *)cVar2._M_node ==
          &(pSVar1->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header) {
        lVar7 = 0;
      }
      else {
        lVar7 = *(long *)(cVar2._M_node + 2);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_p != &aStack_e8) {
        operator_delete(local_f8._M_p,(ulong)(aStack_e8._M_allocated_capacity + 1));
      }
      if (lVar7 != 0) {
        std::__cxx11::string::_M_assign((string *)&local_d0);
      }
      if (((invector) || ((field->native_inline & 1U) != 0)) || (forcopy)) {
        (local_d8->_M_dataplus)._M_p = (pointer)&local_d8->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p == &local_d0.field_2) {
          (local_d8->field_2)._M_allocated_capacity =
               CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                        local_d0.field_2._M_local_buf[0]);
          *(undefined8 *)((long)&local_d8->field_2 + 8) = local_d0.field_2._8_8_;
        }
        else {
          (local_d8->_M_dataplus)._M_p = local_d0._M_dataplus._M_p;
          (local_d8->field_2)._M_allocated_capacity =
               CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                        local_d0.field_2._M_local_buf[0]);
        }
        local_d8->_M_string_length = local_d0._M_string_length;
        local_d0._M_string_length = 0;
        local_d0.field_2._M_local_buf[0] = '\0';
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        GenTypeNativePtr(local_d8,this,&local_d0,field,false);
      }
    }
    else {
      WrapNativeNameInNameSpace_abi_cxx11_
                ((string *)&local_f8,this,pSVar1,&(this->opts_).super_IDLOptions);
      if ((forcopy) || (field->native_inline == true)) {
        (local_d8->_M_dataplus)._M_p = (pointer)&local_d8->field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_d8,local_f8._M_p,
                   local_f8._M_p + (long)&local_f0->super_Definition);
      }
      else {
        GenTypeNativePtr(local_d8,this,(string *)&local_f8,field,false);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_p != &aStack_e8) {
        operator_delete(local_f8._M_p,(ulong)(aStack_e8._M_allocated_capacity + 1));
      }
    }
    __return_storage_ptr__ = local_d8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,
                      CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                               local_d0.field_2._M_local_buf[0]) + 1);
      __return_storage_ptr__ = local_d8;
    }
    break;
  case BASE_TYPE_UNION:
    def = type->enum_def;
    local_f8._M_p = (pointer)&aStack_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
    BaseGenerator::WrapInNameSpace
              (&local_d0,&this->super_BaseGenerator,&def->super_Definition,(string *)&local_f8);
    __return_storage_ptr__ = local_d8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_p != &aStack_e8) {
      operator_delete(local_f8._M_p,(ulong)(aStack_e8._M_allocated_capacity + 1));
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_d0._M_dataplus._M_p,
               local_d0._M_dataplus._M_p + local_d0._M_string_length);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_001886bb:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,
                      CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                               local_d0.field_2._M_local_buf[0]) + 1);
    }
    break;
  default:
    if (((field->value).type.base_type - BASE_TYPE_UTYPE < 0xc) && (field->presence == kOptional)) {
      GenOptionalDecl_abi_cxx11_(__return_storage_ptr__,this,type);
    }
    else {
      GenTypeBasic_abi_cxx11_(__return_storage_ptr__,this,type,true);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenTypeNative(const Type &type, bool invector,
                            const FieldDef &field, bool forcopy = false) {
    switch (type.base_type) {
      case BASE_TYPE_STRING: {
        return NativeString(&field);
      }
      case BASE_TYPE_VECTOR64:
      case BASE_TYPE_VECTOR: {
        const auto type_name = GenTypeNative(type.VectorType(), true, field);
        if (type.struct_def &&
            type.struct_def->attributes.Lookup("native_custom_alloc")) {
          auto native_custom_alloc =
              type.struct_def->attributes.Lookup("native_custom_alloc");
          return "std::vector<" + type_name + "," +
                 native_custom_alloc->constant + "<" + type_name + ">>";
        } else {
          return "std::vector<" + type_name + ">";
        }
      }
      case BASE_TYPE_STRUCT: {
        auto type_name = WrapInNameSpace(*type.struct_def);
        if (IsStruct(type)) {
          auto native_type = type.struct_def->attributes.Lookup("native_type");
          if (native_type) { type_name = native_type->constant; }
          if (invector || field.native_inline || forcopy) {
            return type_name;
          } else {
            return GenTypeNativePtr(type_name, &field, false);
          }
        } else {
          const auto nn = WrapNativeNameInNameSpace(*type.struct_def, opts_);
          return (forcopy || field.native_inline)
                     ? nn
                     : GenTypeNativePtr(nn, &field, false);
        }
      }
      case BASE_TYPE_UNION: {
        auto type_name = WrapInNameSpace(*type.enum_def);
        return type_name + "Union";
      }
      default: {
        return field.IsScalarOptional() ? GenOptionalDecl(type)
                                        : GenTypeBasic(type, true);
      }
    }
  }